

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  sqlite3 *db;
  int err_code;
  char *in_RAX;
  char *zFormat;
  char *zErr;
  char *local_28;
  
  if (pBlob == (sqlite3_blob *)0x0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x19174,
                "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
    return 0x15;
  }
  db = *(sqlite3 **)(pBlob + 0x20);
  local_28 = in_RAX;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (*(long *)(pBlob + 0x18) == 0) {
    err_code = 4;
  }
  else {
    *(undefined4 *)(*(long *)(pBlob + 0x18) + 0x34) = 0;
    err_code = blobSeekToRow((Incrblob *)pBlob,iRow,&local_28);
    if (err_code == 0) {
      err_code = 0;
      if (db->mallocFailed == '\0') goto LAB_00120542;
    }
    else {
      zFormat = "%s";
      if (local_28 == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      sqlite3ErrorWithMsg(db,err_code,zFormat,local_28);
      if (local_28 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_28);
      }
    }
  }
  err_code = apiHandleError(db,err_code);
LAB_00120542:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return err_code;
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    ((Vdbe*)p->pStmt)->rc = SQLITE_OK;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}